

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O2

vec<4UL,_double> * __thiscall
mat<4UL,_4UL>::col(vec<4UL,_double> *__return_storage_ptr__,mat<4UL,_4UL> *this,size_t idx)

{
  double dVar1;
  double *pdVar2;
  size_t i;
  vec<4UL,_double> *this_00;
  
  if (idx < 4) {
    __return_storage_ptr__->data[2] = 0.0;
    __return_storage_ptr__->data[3] = 0.0;
    __return_storage_ptr__->data[0] = 0.0;
    __return_storage_ptr__->data[1] = 0.0;
    this_00 = this->rows + 3;
    for (i = 3; i != 0xffffffffffffffff; i = i - 1) {
      dVar1 = vec<4UL,_double>::operator[](this_00,idx);
      pdVar2 = vec<4UL,_double>::operator[](__return_storage_ptr__,i);
      *pdVar2 = dVar1;
      this_00 = this_00 + -1;
    }
    return __return_storage_ptr__;
  }
  __assert_fail("idx >= 0 && idx < ncols",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cdgiessen[P]TinyRenderer/ext/geometry.h"
                ,0xb5,"vec<nrows, double> mat<4, 4>::col(const size_t) const [nrows = 4, ncols = 4]"
               );
}

Assistant:

vec<nrows, double> col(const size_t idx) const
    {
        assert(idx >= 0 && idx < ncols);
        vec<nrows, double> ret;
        for (size_t i = nrows; i--; ret[i] = rows[i][idx])
            ;
        return ret;
    }